

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O1

void __thiscall
biosoup::test::BiosoupTimerTest_Stop_Test::~BiosoupTimerTest_Stop_Test
          (BiosoupTimerTest_Stop_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupTimerTest, Stop) {
  Timer t{};
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_EQ(0, t.elapsed_time());
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Stop();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.512, 0.768, t.elapsed_time()));
}